

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::ArrayInputStream::ArrayInputStream
          (ArrayInputStream *this,void *data,int size,int block_size)

{
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__ZeroCopyInputStream_001b9268;
  this->data_ = (uint8_t *)data;
  this->size_ = size;
  if (0 < block_size) {
    size = block_size;
  }
  this->block_size_ = size;
  this->position_ = 0;
  this->last_returned_size_ = 0;
  return;
}

Assistant:

ArrayInputStream::ArrayInputStream(const void* data, int size, int block_size)
    : data_(reinterpret_cast<const uint8_t*>(data)),
      size_(size),
      block_size_(block_size > 0 ? block_size : size),
      position_(0),
      last_returned_size_(0) {}